

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_msg.h
# Opt level: O1

void __thiscall
nodecpp::platform::internal_msg::InternalMsg::appendUint8(InternalMsg *this,uint8_t what)

{
  ulong uVar1;
  ulong uVar2;
  
  if ((this->currentPage).ptr == (uint8_t *)0x0) {
    if (this->totalSz == 0) {
      reserveSpaceForConvertionToTag(this);
    }
    else {
      implAddPage(this);
    }
    if ((this->currentPage).ptr == (uint8_t *)0x0) {
      assert::onAssertionFailed
                ("/workspace/llm4binary/github/license_all_cmakelists_25/node-dot-cpp[P]nodecpp-foundation/include/internal_msg.h"
                 ,0x216,"currentPage.page() != nullptr",true);
    }
  }
  uVar2 = this->totalSz & 0xfff;
  (this->currentPage).ptr[uVar2] = what;
  uVar1 = this->totalSz + 1;
  this->totalSz = uVar1;
  if (uVar2 == 0xfff) {
    if ((uVar1 & 0xfff) != 0) {
      assert::onAssertionFailed
                ("/workspace/llm4binary/github/license_all_cmakelists_25/node-dot-cpp[P]nodecpp-foundation/include/internal_msg.h"
                 ,0x21e,"offsetInCurrentPage() == 0",true);
    }
    (this->currentPage).ptr = (uint8_t *)0x0;
  }
  return;
}

Assistant:

void appendUint8( uint8_t what )
		{
			if ( currentPage.page() == nullptr )
			{
				if ( totalSz )
					implAddPage();
				else
				{
					NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::pedantic, currentPage.page() == nullptr );
					reserveSpaceForConvertionToTag();
				}
				NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::pedantic, currentPage.page() != nullptr );
			}
			size_t remainingInPage = remainingSizeInCurrentPage();
			NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::pedantic, remainingInPage != 0 );
			*(currentPage.page() + offsetInCurrentPage()) = what;
			++totalSz;
			if( 1 == remainingInPage )
			{
				NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::pedantic, offsetInCurrentPage() == 0 );
				currentPage.init();
			}
		}